

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byteorder.c
# Opt level: O3

ExprInfo expr_info(List *expr,ByteOrder hint,ExprInfo *field_info)

{
  int iVar1;
  byte bVar2;
  byte bVar3;
  TokenType TVar4;
  ByteOrder BVar5;
  BOOL BVar6;
  char *pcVar7;
  BOOL BVar8;
  ListStruct *pLVar9;
  char *fmt;
  ulong uVar10;
  ByteSize BVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  ExprInfo EVar15;
  char buf [256];
  char local_138 [264];
  
  if (expr == (List *)0x0) {
    BVar8 = FALSE;
    uVar10 = 0;
    goto LAB_0010f0d7;
  }
  TVar4 = (expr->token).type;
  uVar10 = 2;
  uVar13 = 8;
  BVar8 = TRUE;
  BVar6 = TRUE;
  switch(TVar4) {
  case TOK_FALSE:
  case TOK_TRUE:
  case TOK_CCC:
  case TOK_CCN:
  case TOK_CCV:
  case TOK_CCX:
  case TOK_CCNZ:
    BVar6 = FALSE;
  case TOK_NUMBER:
switchD_0010ede3_caseD_1d:
    BVar8 = BVar6;
    uVar13 = 0;
    break;
  case TOK_IF:
  case TOK_SWITCH:
  case TOK_AND:
  case TOK_OR:
  case TOK_XOR:
  case TOK_NOT:
  case TOK_EQUAL:
  case TOK_NOT_EQUAL:
  case TOK_GREATER_THAN:
  case TOK_LESS_THAN:
  case TOK_GREATER_OR_EQUAL:
  case TOK_LESS_OR_EQUAL:
  case TOK_AMODE_PTR:
  case TOK_REVERSED_AMODE_PTR:
  case TOK_IDENTIFIER:
  case TOK_LEFT_PAREN:
  case TOK_RIGHT_PAREN:
  case TOK_NOP:
  case TOK_UNION:
  case TOK_INTERSECT:
switchD_0010ede3_caseD_2:
    pcVar7 = unparse_token(&expr->token,local_138);
    fmt = "byteorder.c: Don\'t know how to process endianness/byte size for %s.\n";
LAB_0010ee59:
    parse_error(expr,fmt,pcVar7);
LAB_0010ee6b:
    BVar8 = FALSE;
    uVar13 = 0;
    uVar10 = 0;
    break;
  case TOK_DEFAULT:
switchD_0010ede3_caseD_4:
    uVar14 = 4;
    goto switchD_0010ee3e_caseD_3a;
  case TOK_DOLLAR_DATA_REGISTER:
  case TOK_DOLLAR_ADDRESS_REGISTER:
  case TOK_DOLLAR_GENERAL_REGISTER:
  case TOK_DATA_REGISTER:
  case TOK_ADDRESS_REGISTER:
  case TOK_TEMP_REGISTER:
switchD_0010ede3_caseD_f:
    uVar13 = (ulong)(expr->token).u.reginfo.size;
    BVar8 = (BOOL)(expr->token).u.reginfo.sgnd;
    break;
  case TOK_DOLLAR_AMODE:
  case TOK_DOLLAR_REVERSED_AMODE:
  case TOK_AMODE:
  case TOK_REVERSED_AMODE:
    uVar13 = (ulong)(expr->token).u.reginfo.size;
    BVar8 = (BOOL)(expr->token).u.reginfo.sgnd;
    uVar10 = 3;
    break;
  case TOK_DOLLAR_NUMBER:
    bVar2 = (expr->token).u.reginfo.which;
    BVar5 = field_info[bVar2].order;
    bVar3 = (expr->token).u.reginfo.size;
    uVar13 = (ulong)bVar3;
    BVar8 = (BOOL)(expr->token).u.reginfo.sgnd;
    uVar10 = (ulong)BVar5;
    if (field_info[bVar2].size != (uint)bVar3 && field_info[bVar2].size != BS_UNKNOWN) {
      pcVar7 = unparse_token(&expr->token,local_138);
      parse_error(expr,"Operand field %s defined with more than one different size! (%d/%d)\n",
                  pcVar7,(ulong)field_info[(expr->token).u.reginfo.which].size,
                  (ulong)(expr->token).u.reginfo.size);
    }
    break;
  case TOK_DOLLAR_AMODE_PTR:
  case TOK_DOLLAR_REVERSED_AMODE_PTR:
    break;
  case TOK_QUOTED_STRING:
switchD_0010ede3_caseD_1c:
    uVar13 = 4;
    break;
  default:
    uVar14 = uVar13;
    if (TVar4 == TOK_CODE) goto switchD_0010ee3e_caseD_3a;
    if (TVar4 != TOK_LIST) goto switchD_0010ede3_caseD_2;
    expr = expr->car;
    TVar4 = (expr->token).type;
    if (0x4a < TVar4 - TOK_IF) {
switchD_0010ee3e_caseD_f:
      pcVar7 = unparse_token(&expr->token,local_138);
      fmt = "byteorder.c: Don\'t know how to process endianness/byte size for operator %s.\n";
      goto LAB_0010ee59;
    }
    uVar13 = 0;
    uVar14 = 0;
    switch(TVar4) {
    case TOK_IF:
    case TOK_SWITCH:
    case TOK_EXPLICIT_LIST:
    case TOK_LIST:
      goto LAB_0010ee6b;
    case TOK_DEFAULT:
      goto switchD_0010ede3_caseD_4;
    case TOK_AND:
    case TOK_OR:
    case TOK_XOR:
    case TOK_NOT:
    case TOK_EQUAL:
    case TOK_NOT_EQUAL:
    case TOK_GREATER_THAN:
    case TOK_LESS_THAN:
    case TOK_GREATER_OR_EQUAL:
    case TOK_LESS_OR_EQUAL:
      uVar14 = 1;
    case TOK_CAST:
switchD_0010ee3e_caseD_3a:
      uVar13 = uVar14;
      BVar8 = FALSE;
      break;
    default:
      goto switchD_0010ee3e_caseD_f;
    case TOK_SHIFT_LEFT:
    case TOK_SHIFT_RIGHT:
      EVar15 = expr_info(expr->cdr,hint,field_info);
      goto LAB_0010f0b7;
    case TOK_ASSIGN:
      pLVar9 = expr->cdr;
      if ((pLVar9->token).type - TOK_CCC < 5) {
        pLVar9 = pLVar9->cdr;
      }
      EVar15 = expr_info(pLVar9,hint,field_info);
      uVar10 = EVar15._0_8_;
LAB_0010f0b7:
      BVar8 = EVar15.sgnd;
      uVar13 = EVar15._0_8_ >> 0x20;
      break;
    case TOK_PLUS:
    case TOK_MINUS:
    case TOK_MULTIPLY:
    case TOK_DIVIDE:
    case TOK_MOD:
      pLVar9 = expr->cdr;
      if (pLVar9 == (ListStruct *)0x0) {
        uVar13 = 0;
      }
      else {
        BVar11 = BS_UNKNOWN;
        do {
          EVar15 = expr_info(pLVar9,hint,field_info);
          uVar13 = EVar15._0_8_ >> 0x20;
          if (EVar15.size < BVar11) {
            uVar13 = (ulong)BVar11;
          }
          pLVar9 = pLVar9->cdr;
          BVar11 = (ByteSize)uVar13;
        } while (pLVar9 != (ListStruct *)0x0);
      }
      do {
        expr = expr->cdr;
        if (expr == (List *)0x0) break;
        EVar15 = expr_info(expr,hint,field_info);
      } while (EVar15.sgnd != FALSE);
      BVar8 = (BOOL)(expr == (List *)0x0);
      break;
    case TOK_BITWISE_AND:
    case TOK_BITWISE_OR:
    case TOK_BITWISE_XOR:
    case TOK_BITWISE_NOT:
      pLVar9 = expr->cdr;
      uVar10 = (ulong)hint;
      if (pLVar9 != (ListStruct *)0x0) {
        iVar1 = 0;
        BVar8 = TRUE;
        iVar12 = 0;
        do {
          if ((pLVar9->token).type != TOK_NUMBER) {
            EVar15 = expr_info(pLVar9,hint,field_info);
            if (EVar15.order == BO_NATIVE) {
              iVar12 = iVar12 + 1;
            }
            else if (EVar15.order == BO_BIG_ENDIAN) {
              iVar1 = iVar1 + 1;
            }
            if (EVar15.sgnd == FALSE) {
              BVar8 = FALSE;
            }
          }
          pLVar9 = pLVar9->cdr;
        } while (pLVar9 != (ListStruct *)0x0);
        pLVar9 = expr->cdr;
        uVar10 = (ulong)(iVar12 < iVar1 | 2);
        if (iVar1 == iVar12) {
          uVar10 = (ulong)hint;
        }
        BVar6 = BVar8;
        if (pLVar9 == (ListStruct *)0x0) goto switchD_0010ede3_caseD_1d;
        uVar14 = 0;
        do {
          EVar15 = expr_info(pLVar9,hint,field_info);
          uVar13 = EVar15._0_8_ >> 0x20;
          if (EVar15.size < (ByteSize)uVar14) {
            uVar13 = uVar14;
          }
          pLVar9 = pLVar9->cdr;
          uVar14 = uVar13;
        } while (pLVar9 != (ListStruct *)0x0);
      }
      break;
    case TOK_FUNC_CALL:
      goto switchD_0010ede3_caseD_1c;
    case TOK_DEREF:
      bVar2 = (expr->token).u.reginfo.size;
      BVar8 = FALSE;
      if (bVar2 != 0) {
        BVar8 = (BOOL)(expr->token).u.reginfo.sgnd;
        uVar13 = (ulong)bVar2;
        uVar10 = 3;
      }
      break;
    case TOK_SWAP:
      EVar15 = expr_info(expr->cdr,hint,field_info);
      uVar10 = EVar15._0_8_;
      if (EVar15.order == BO_BIG_ENDIAN) {
        uVar10 = 2;
      }
      else if (EVar15.order == BO_NATIVE) {
        uVar10 = 3;
      }
      goto switchD_0010ede3_caseD_f;
    }
  }
  uVar10 = uVar10 & 0xffffffff | uVar13 << 0x20;
LAB_0010f0d7:
  EVar15.sgnd = BVar8;
  EVar15.order = (int)uVar10;
  EVar15.size = (int)(uVar10 >> 0x20);
  return EVar15;
}

Assistant:

static ExprInfo
expr_info (const List *expr, ByteOrder hint, ExprInfo *field_info)
{
  ExprInfo info = { BO_UNKNOWN, BS_UNKNOWN, FALSE };   /* Defaults. */
  const Token *t;
  char buf[256];

  if (expr == NULL)
    return info;

  t = &expr->token;
  switch (t->type) {
  case TOK_DATA_REGISTER:
  case TOK_ADDRESS_REGISTER:
  case TOK_TEMP_REGISTER:
    info.order = BO_NATIVE;
    info.size  = t->u.reginfo.size;
    info.sgnd  = t->u.reginfo.sgnd;
    break;

  case TOK_DOLLAR_DATA_REGISTER:
  case TOK_DOLLAR_ADDRESS_REGISTER:
  case TOK_DOLLAR_GENERAL_REGISTER:
    info.order = BO_NATIVE;
    info.size  = t->u.dollarinfo.size;
    info.sgnd  = t->u.dollarinfo.sgnd;
    break;

  case TOK_DOLLAR_AMODE:              /* We assume that by the time we reach */
  case TOK_DOLLAR_REVERSED_AMODE:     /*  here, all reg amodes have been     */
    info.order = BO_BIG_ENDIAN;       /*  converted to dollar_reg's.         */
    info.size  = t->u.dollarinfo.size;
    info.sgnd  = t->u.dollarinfo.sgnd;
    break;

  case TOK_DOLLAR_AMODE_PTR:
  case TOK_DOLLAR_REVERSED_AMODE_PTR:
    info.order = BO_NATIVE;
    info.size  = sizeof (void *);
    info.sgnd  = TRUE;
    break;

  case TOK_AMODE:                     /* We assume that by the time we reach */
  case TOK_REVERSED_AMODE:            /*  here, all reg amodes have been     */
    info.order = BO_BIG_ENDIAN;       /*  converted to dollar_reg's.         */
    info.size  = t->u.amodeinfo.size;
    info.sgnd  = t->u.amodeinfo.sgnd;
    break;

  case TOK_CODE:
    info.order = BO_NATIVE;
    info.size  = sizeof (void *);
    info.sgnd  = FALSE;
    break;

  case TOK_NUMBER:
    info.order = BO_NATIVE;
    info.size  = BS_UNKNOWN;
    info.sgnd  = TRUE;
    break;

  case TOK_DEFAULT:
    info.order = BO_NATIVE;   /* So it's a legal case number. */
    info.size  = BS_LONG;
    info.sgnd  = FALSE;
    break;

  case TOK_CCC:
  case TOK_CCN:
  case TOK_CCV:
  case TOK_CCX:
  case TOK_CCNZ:
    info.order = BO_NATIVE;
#ifdef CCR_ELEMENT_8_BITS
    info.size  = BS_BYTE;
#else
    info.size  = BS_UNKNOWN;
#endif
    info.sgnd  = FALSE;
    break;

  case TOK_DOLLAR_NUMBER:
    info.order = field_info[t->u.dollarinfo.which].order;
    info.size  = t->u.dollarinfo.size;
    info.sgnd  = t->u.dollarinfo.sgnd;
    if (field_info[t->u.dollarinfo.which].size != BS_UNKNOWN
	&& field_info[t->u.dollarinfo.which].size != info.size)
      parse_error (expr, "Operand field %s defined with more than one "
		   "different size! (%d/%d)\n",
		   unparse_token (t, buf),
		   field_info[t->u.dollarinfo.which].size,
		   t->u.dollarinfo.size);
    break;

  case TOK_FALSE:
  case TOK_TRUE:
    info.order = BO_NATIVE;
    info.size  = BS_UNKNOWN;
    info.sgnd  = NO;
    break;

  case TOK_QUOTED_STRING:
    info.order = BO_NATIVE;
    info.size  = BS_LONG;  /* Who knows what is appropriate here. */
    info.sgnd  = TRUE;     /* Sure, why not. */
    break;

  case TOK_LIST:
    expr = expr->car;
    t = &expr->token;
    switch (t->type) {
    case TOK_PLUS:
    case TOK_MINUS:
    case TOK_MULTIPLY:
    case TOK_DIVIDE:
    case TOK_MOD:
      info.order = BO_NATIVE;
      info.size  = expr_list_max_size (expr->cdr, hint, field_info);
      info.sgnd  = !expr_list_any_are_unsigned (expr->cdr, hint, field_info);
      break;

    case TOK_SHIFT_LEFT:
    case TOK_SHIFT_RIGHT:
      info = expr_info (expr->cdr, hint, field_info);  /* Get defaults. */
      info.order = BO_NATIVE;
      break;

    case TOK_BITWISE_AND:
    case TOK_BITWISE_OR:
    case TOK_BITWISE_XOR:
    case TOK_BITWISE_NOT:
      {
	List *l2;
	int big = 0, native = 0;
	info.sgnd = TRUE;
	for (l2 = expr->cdr; l2 != NULL; l2 = l2->cdr)
	  {
	    if (l2->token.type != TOK_NUMBER)
	      {
		ExprInfo info2 = expr_info (l2, hint, field_info);
		if (info2.order == BO_BIG_ENDIAN)
		  big++;
		else if (info2.order == BO_NATIVE)
		  native++;
		if (!info2.sgnd)
		  info.sgnd = FALSE;
	      }
	  }
	if (big == native)  /* Tie?  Then stick with the hint. */
	  info.order = hint;
	else info.order = (big > native) ? BO_BIG_ENDIAN : BO_NATIVE;
	info.size = expr_list_max_size (expr->cdr, hint, field_info);
      }
      break;

    case TOK_SWAP:
      info = expr_info (expr->cdr, hint, field_info);
      if (info.order == BO_BIG_ENDIAN)
	info.order = BO_NATIVE;
      else if (info.order == BO_NATIVE)
	info.order = BO_BIG_ENDIAN;
      info.size = t->u.swapinfo.size;
      info.sgnd = t->u.swapinfo.sgnd;
      break;

    case TOK_LIST:
      /* Stick with "unknown" default. */
      break;

    case TOK_ASSIGN:
#ifndef CCR_ELEMENT_8_BITS
      if (IS_CCBIT_TOKEN (expr->cdr->token.type))
	{
	  info = expr_info (CDDR (expr), hint, field_info);   /* rhs */
	}
      else
#endif
	{
	  info = expr_info (expr->cdr, hint, field_info);     /* lhs */
	}
      break;

    case TOK_CAST:
      info.order = BO_NATIVE;
      info.size  = BS_UNKNOWN;
      info.sgnd = FALSE;  /* Who knows? */
      break;

    case TOK_DEREF:
      if (t->u.derefinfo.size == 0)
	{
	  info.order = BO_NATIVE;
	  info.size  = BS_UNKNOWN;
	  info.sgnd  = FALSE;  /* Who knows? */
	}
      else
	{
	  info.order = BO_BIG_ENDIAN;
	  info.size  = t->u.derefinfo.size;
	  info.sgnd  = t->u.derefinfo.sgnd;
	}
      break;

    case TOK_EQUAL:
    case TOK_NOT_EQUAL:
    case TOK_GREATER_THAN:
    case TOK_LESS_THAN:
    case TOK_GREATER_OR_EQUAL:
    case TOK_LESS_OR_EQUAL:
    case TOK_AND:
    case TOK_OR:
    case TOK_XOR:
    case TOK_NOT:
      info.order = BO_NATIVE;
      info.size  = BS_BYTE;
      info.sgnd  = FALSE;
      break;

    case TOK_SWITCH:
    case TOK_IF:
      break;

    case TOK_DEFAULT:
      info.order = BO_NATIVE;   /* So it's a legal case number. */
      info.size  = BS_LONG;
      info.sgnd  = FALSE;
      break;

    case TOK_EXPLICIT_LIST:   /* Unknown everything. */
      break;

    case TOK_FUNC_CALL:
      info.order = BO_NATIVE;
      info.size  = BS_LONG;
      info.sgnd  = TRUE;  /* Who knows? */
      break;
      
    default:
      parse_error (expr, "byteorder.c: Don't know how to process "
		   "endianness/byte size for operator %s.\n",
		   unparse_token (t, buf));
      break;
    }
    break;

  default:
    parse_error (expr, "byteorder.c: Don't know how to process "
		 "endianness/byte size for %s.\n", unparse_token (t, buf));
    break;
  }

  return info;
}